

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_inflate.c
# Opt level: O0

REF_STATUS ref_inflate_pri_min_dot(REF_NODE ref_node,REF_INT *nodes,REF_DBL *min_dot)

{
  uint uVar1;
  double local_c8;
  double local_c0;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rsb;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT i;
  REF_INT node;
  REF_DBL edge [3];
  double local_78;
  REF_DBL bot_normal [3];
  double local_58;
  REF_DBL top_normal [3];
  uint local_34;
  uint local_30;
  REF_INT tri_nodes [3];
  REF_DBL *min_dot_local;
  REF_INT *nodes_local;
  REF_NODE ref_node_local;
  
  local_34 = *nodes;
  local_30 = nodes[1];
  tri_nodes[0] = nodes[2];
  tri_nodes._4_8_ = min_dot;
  ref_node_local._4_4_ = ref_node_tri_normal(ref_node,(REF_INT *)&local_34,&local_78);
  if (ref_node_local._4_4_ == 0) {
    ref_node_local._4_4_ = ref_math_normalize(&local_78);
    if (ref_node_local._4_4_ == 0) {
      local_34 = nodes[3];
      local_30 = nodes[4];
      tri_nodes[0] = nodes[5];
      ref_node_local._4_4_ = ref_node_tri_normal(ref_node,(REF_INT *)&local_34,&local_58);
      if (ref_node_local._4_4_ == 0) {
        ref_node_local._4_4_ = ref_math_normalize(&local_58);
        if (ref_node_local._4_4_ == 0) {
          *(undefined8 *)tri_nodes._4_8_ = 0x3ff0000000000000;
          for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < 3;
              ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
            for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < 3;
                ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
              *(double *)(&i + (long)ref_private_macro_code_rss_1 * 2) =
                   ref_node->real
                   [ref_private_macro_code_rss_1 + nodes[ref_private_macro_code_rss + 3] * 0xf] -
                   ref_node->real
                   [ref_private_macro_code_rss_1 + nodes[ref_private_macro_code_rss] * 0xf];
            }
            uVar1 = ref_math_normalize((REF_DBL *)&i);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                     ,0x46,"ref_inflate_pri_min_dot",(ulong)uVar1,"norm edge0");
              return uVar1;
            }
            if (edge[1] * bot_normal[1] + _i * local_78 + edge[0] * bot_normal[0] <=
                *(double *)tri_nodes._4_8_) {
              local_c0 = edge[1] * bot_normal[1] + _i * local_78 + edge[0] * bot_normal[0];
            }
            else {
              local_c0 = *(double *)tri_nodes._4_8_;
            }
            *(double *)tri_nodes._4_8_ = local_c0;
            if (edge[1] * top_normal[1] + _i * local_58 + edge[0] * top_normal[0] <=
                *(double *)tri_nodes._4_8_) {
              local_c8 = edge[1] * top_normal[1] + _i * local_58 + edge[0] * top_normal[0];
            }
            else {
              local_c8 = *(double *)tri_nodes._4_8_;
            }
            *(double *)tri_nodes._4_8_ = local_c8;
          }
          ref_node_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                 ,0x3e,"ref_inflate_pri_min_dot",(ulong)ref_node_local._4_4_,"norm top");
          printf("%d %d %d %f %f %f\n",local_58,top_normal[0],top_normal[1],(ulong)local_34,
                 (ulong)local_30,(ulong)(uint)tri_nodes[0]);
          printf("%f %f %f\n",ref_node->real[(int)(local_34 * 0xf)],
                 ref_node->real[(int)(local_34 * 0xf + 1)],ref_node->real[(int)(local_34 * 0xf + 2)]
                );
          printf("%f %f %f\n",ref_node->real[(int)(local_30 * 0xf)],
                 ref_node->real[(int)(local_30 * 0xf + 1)],ref_node->real[(int)(local_30 * 0xf + 2)]
                );
          printf("%f %f %f\n",ref_node->real[tri_nodes[0] * 0xf],
                 ref_node->real[tri_nodes[0] * 0xf + 1],ref_node->real[tri_nodes[0] * 0xf + 2]);
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",
               0x31,"ref_inflate_pri_min_dot",(ulong)ref_node_local._4_4_,"top");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",
             0x2c,"ref_inflate_pri_min_dot",(ulong)ref_node_local._4_4_,"norm bot");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",0x2b,
           "ref_inflate_pri_min_dot",(ulong)ref_node_local._4_4_,"bot");
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_inflate_pri_min_dot(REF_NODE ref_node, REF_INT *nodes,
                                           REF_DBL *min_dot) {
  REF_INT tri_nodes[3];
  REF_DBL top_normal[3];
  REF_DBL bot_normal[3];
  REF_DBL edge[3];
  REF_INT node, i;

  tri_nodes[0] = nodes[0];
  tri_nodes[1] = nodes[1];
  tri_nodes[2] = nodes[2];
  RSS(ref_node_tri_normal(ref_node, tri_nodes, bot_normal), "bot");
  RSS(ref_math_normalize(bot_normal), "norm bot");

  tri_nodes[0] = nodes[3];
  tri_nodes[1] = nodes[4];
  tri_nodes[2] = nodes[5];
  RSS(ref_node_tri_normal(ref_node, tri_nodes, top_normal), "top");
  RSB(ref_math_normalize(top_normal), "norm top", {
    printf("%d %d %d %f %f %f\n", tri_nodes[0], tri_nodes[1], tri_nodes[2],
           top_normal[0], top_normal[1], top_normal[2]);
    printf("%f %f %f\n", ref_node_xyz(ref_node, 0, tri_nodes[0]),
           ref_node_xyz(ref_node, 1, tri_nodes[0]),
           ref_node_xyz(ref_node, 2, tri_nodes[0]));
    printf("%f %f %f\n", ref_node_xyz(ref_node, 0, tri_nodes[1]),
           ref_node_xyz(ref_node, 1, tri_nodes[1]),
           ref_node_xyz(ref_node, 2, tri_nodes[1]));
    printf("%f %f %f\n", ref_node_xyz(ref_node, 0, tri_nodes[2]),
           ref_node_xyz(ref_node, 1, tri_nodes[2]),
           ref_node_xyz(ref_node, 2, tri_nodes[2]));
  });

  *min_dot = 1.0;
  for (node = 0; node < 3; node++) {
    for (i = 0; i < 3; i++) {
      edge[i] = ref_node_xyz(ref_node, i, nodes[node + 3]) -
                ref_node_xyz(ref_node, i, nodes[node]);
    }
    RSS(ref_math_normalize(edge), "norm edge0");
    *min_dot = MIN(*min_dot, ref_math_dot(edge, bot_normal));
    *min_dot = MIN(*min_dot, ref_math_dot(edge, top_normal));
  }

  return REF_SUCCESS;
}